

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::MapObjectHelper<unsigned_long>
              (RecyclableObject *obj,unsigned_long length,unsigned_long start,
              RecyclableObject *newObj,JavascriptArray *newArr,bool isBuiltinArrayCtor,
              RecyclableObject *callBackFn,Var thisArg,ScriptContext *scriptContext)

{
  bool bVar1;
  uint uVar2;
  ThreadContext *pTVar3;
  Var pvVar4;
  JavascriptMethod p_Var5;
  Var pvVar6;
  Var aItem;
  BigIndex idxDest;
  BigIndex index;
  BigIndex local_d8;
  BigIndex local_c8;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined1 local_a8 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  unsigned_long uStack_90;
  BOOL hasItem;
  unsigned_long k;
  Var mappedValue;
  Var element;
  CallInfo callBackFnInfo;
  undefined1 local_60 [8];
  JsReentLock jsReentLock;
  bool isBuiltinArrayCtor_local;
  JavascriptArray *newArr_local;
  RecyclableObject *newObj_local;
  unsigned_long start_local;
  unsigned_long length_local;
  RecyclableObject *obj_local;
  
  jsReentLock._31_1_ = isBuiltinArrayCtor;
  pTVar3 = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_60,pTVar3);
  JsReentLock::setObjectForMutation((JsReentLock *)local_60,obj);
  CallInfo::CallInfo((CallInfo *)((long)&element + 4),CallFlags_Value,4);
  for (uStack_90 = start; uStack_90 < length; uStack_90 = uStack_90 + 1) {
    JsReentLock::unlock((JsReentLock *)local_60);
    autoReentrancyHandler._12_4_ = Js::JavascriptOperators::HasItem(obj,uStack_90);
    JsReentLock::MutateArrayObject((JsReentLock *)local_60);
    JsReentLock::relock((JsReentLock *)local_60);
    if (autoReentrancyHandler._12_4_ != 0) {
      JsReentLock::unlock((JsReentLock *)local_60);
      pvVar4 = Js::JavascriptOperators::GetItem(obj,uStack_90,scriptContext);
      pTVar3 = ScriptContext::GetThreadContext(scriptContext);
      AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_a8,pTVar3);
      pTVar3 = ScriptContext::GetThreadContext(scriptContext);
      ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar3);
      pTVar3 = ScriptContext::GetThreadContext(scriptContext);
      ThreadContext::AssertJsReentrancy(pTVar3);
      p_Var5 = RecyclableObject::GetEntryPoint(callBackFn);
      CheckIsExecutable(callBackFn,p_Var5);
      p_Var5 = RecyclableObject::GetEntryPoint(callBackFn);
      local_b0 = stack0xffffffffffffff8c;
      local_b8 = stack0xffffffffffffff8c;
      pvVar6 = JavascriptNumber::ToVar(uStack_90,scriptContext);
      aItem = (Var)0x0;
      pvVar4 = (*p_Var5)(callBackFn,(CallInfo)callBackFn,local_b0,0,0,0,0,local_b8,thisArg,pvVar4,
                         pvVar6,obj);
      AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_a8);
      JsReentLock::MutateArrayObject((JsReentLock *)local_60);
      JsReentLock::relock((JsReentLock *)local_60);
      if ((newArr == (JavascriptArray *)0x0) || ((jsReentLock._31_1_ & 1) == 0)) {
        JsReentLock::unlock((JsReentLock *)local_60);
        BigIndex::BigIndex(&local_c8,uStack_90);
        idxDest.bigIndex = (uint64)pvVar4;
        idxDest._0_8_ = local_c8.bigIndex;
        uVar2 = SetArrayLikeObjects((JavascriptArray *)newObj,
                                    (RecyclableObject *)(ulong)local_c8.index,idxDest,aItem);
        BigIndex::BigIndex(&local_d8,uStack_90);
        index.bigIndex = (uint64)aItem;
        index._0_8_ = local_d8.bigIndex;
        ThrowErrorOnFailure((JavascriptArray *)(ulong)uVar2,(BOOL)scriptContext,
                            (ScriptContext *)(ulong)local_d8.index,index);
        JsReentLock::MutateArrayObject((JsReentLock *)local_60);
        JsReentLock::relock((JsReentLock *)local_60);
      }
      else {
        (*(newArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                  (newArr,uStack_90 & 0xffffffff,pvVar4,0);
      }
    }
  }
  bVar1 = IsNonES5Array(newObj);
  if (bVar1) {
    (*(newArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
      .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])();
  }
  JsReentLock::~JsReentLock((JsReentLock *)local_60);
  return newObj;
}

Assistant:

Var JavascriptArray::MapObjectHelper(RecyclableObject* obj, T length, T start, RecyclableObject* newObj, JavascriptArray* newArr,
        bool isBuiltinArrayCtor, RecyclableObject* callBackFn, Var thisArg, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, obj);

        CallInfo callBackFnInfo = CallInfo(CallFlags_Value, 4);
        Var element = nullptr;
        Var mappedValue = nullptr;

        for (T k = start; k < length; k++)
        {
            JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, k));
            if (hasItem)
            {
                JS_REENTRANT(jsReentLock,
                    element = JavascriptOperators::GetItem(obj, k, scriptContext);
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        mappedValue = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, callBackFnInfo, thisArg,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                obj);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                    if (newArr && isBuiltinArrayCtor)
                    {
                        newArr->SetItem((uint32)k, mappedValue, PropertyOperation_None);
                    }
                    else
                    {
                        JS_REENTRANT(jsReentLock, ThrowErrorOnFailure(JavascriptArray::SetArrayLikeObjects(newObj, BigIndex(k), mappedValue), scriptContext, BigIndex(k)));
                    }
            }
        }

#ifdef VALIDATE_ARRAY
        if (JavascriptArray::IsNonES5Array(newObj))
        {
            newArr->ValidateArray();
        }
#endif

        return newObj;
    }